

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_long>::Add
          (RepeatedFieldWrapper<unsigned_long> *this,Field *data,Value *value)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long *puVar3;
  unsigned_long tmp;
  
  iVar2 = (*(this->super_RandomAccessRepeatedFieldAccessor).super_RepeatedFieldAccessor.
            _vptr_RepeatedFieldAccessor[0x10])(this,value);
  uVar1 = *data;
  if (uVar1 == *(uint *)((long)data + 4)) {
    RepeatedField<unsigned_long>::Reserve((RepeatedField<unsigned_long> *)data,uVar1 + 1);
    puVar3 = RepeatedField<unsigned_long>::elements((RepeatedField<unsigned_long> *)data);
    puVar3[uVar1] = CONCAT44(extraout_var,iVar2);
  }
  else {
    puVar3 = RepeatedField<unsigned_long>::elements((RepeatedField<unsigned_long> *)data);
    puVar3[uVar1] = CONCAT44(extraout_var,iVar2);
  }
  *(uint *)data = uVar1 + 1;
  return;
}

Assistant:

void Add(Field* data, const Value* value) const override {
    MutableRepeatedField(data)->Add(ConvertToT(value));
  }